

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

void __thiscall minibag::Bag::swap(Bag *this,Bag *other)

{
  ChunkedFile *in_RSI;
  ChunkedFile *in_RDI;
  ChunkInfo *in_stack_00000028;
  ChunkInfo *in_stack_00000030;
  
  std::swap<minibag::bagmode::BagMode>((BagMode *)in_RDI,(BagMode *)in_RSI);
  minibag::swap(in_RSI,in_RDI);
  std::swap<int>((int *)&in_RDI[1].filename_._M_string_length,
                 (int *)&in_RSI[1].filename_._M_string_length);
  std::swap<minibag::compression::CompressionType>
            ((CompressionType *)((long)&in_RDI[1].filename_._M_string_length + 4),
             (CompressionType *)((long)&in_RSI[1].filename_._M_string_length + 4));
  std::swap<unsigned_int>
            ((uint *)&in_RDI[1].filename_.field_2._M_allocated_capacity,
             (uint *)&in_RSI[1].filename_.field_2._M_allocated_capacity);
  std::swap<unsigned_int>
            ((uint *)(in_RDI[1].filename_.field_2._M_local_buf + 4),
             (uint *)(in_RSI[1].filename_.field_2._M_local_buf + 4));
  std::swap<unsigned_long>
            ((unsigned_long *)(in_RDI[1].filename_.field_2._M_local_buf + 8),
             (unsigned_long *)(in_RSI[1].filename_.field_2._M_local_buf + 8));
  std::swap<unsigned_long>((unsigned_long *)&in_RDI[1].file_,(unsigned_long *)&in_RSI[1].file_);
  std::swap<unsigned_long>(&in_RDI[1].offset_,&in_RSI[1].offset_);
  std::swap<unsigned_int>((uint *)&in_RDI[1].compressed_in_,(uint *)&in_RSI[1].compressed_in_);
  std::swap<unsigned_int>
            ((uint *)((long)&in_RDI[1].compressed_in_ + 4),
             (uint *)((long)&in_RSI[1].compressed_in_ + 4));
  std::swap<bool>((bool *)&in_RDI[1].unused_,(bool *)&in_RSI[1].unused_);
  std::swap<minibag::ChunkInfo>(in_stack_00000030,in_stack_00000028);
  std::swap<unsigned_long>
            (&in_RDI[2].filename_.field_2._M_allocated_capacity,
             &in_RSI[2].filename_.field_2._M_allocated_capacity);
  std::
  swap<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_RSI,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_RDI);
  std::
  swap<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,unsigned_int,std::less<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::pair<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const,unsigned_int>>>
            ((map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::less<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int>_>_>
              *)in_RSI,
             (map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int,_std::less<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_unsigned_int>_>_>
              *)in_RDI);
  std::
  swap<unsigned_int,minibag::ConnectionInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,minibag::ConnectionInfo*>>>
            ((map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
              *)in_RSI,
             (map<unsigned_int,_minibag::ConnectionInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
              *)in_RDI);
  std::swap<minibag::ChunkInfo,std::allocator<minibag::ChunkInfo>>
            ((vector<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_> *)in_RSI,
             (vector<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_> *)in_RDI);
  std::
  swap<unsigned_int,std::multiset<minibag::IndexEntry,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::multiset<minibag::IndexEntry,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>>>>
            ((map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
              *)in_RSI,
             (map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
              *)in_RDI);
  std::
  swap<unsigned_int,std::multiset<minibag::IndexEntry,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::multiset<minibag::IndexEntry,std::less<minibag::IndexEntry>,std::allocator<minibag::IndexEntry>>>>>
            ((map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
              *)in_RSI,
             (map<unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
              *)in_RDI);
  minibag::swap((Buffer *)in_RSI,(Buffer *)in_RDI);
  minibag::swap((Buffer *)in_RSI,(Buffer *)in_RDI);
  minibag::swap((Buffer *)in_RSI,(Buffer *)in_RDI);
  minibag::swap((Buffer *)in_RSI,(Buffer *)in_RDI);
  minibag::swap((Buffer *)in_RSI,(Buffer *)in_RDI);
  std::swap<minibag::Buffer*>
            ((Buffer **)&in_RDI[5].filename_._M_string_length,
             (Buffer **)&in_RSI[5].filename_._M_string_length);
  std::swap<unsigned_long>
            (&in_RDI[5].filename_.field_2._M_allocated_capacity,
             &in_RSI[5].filename_.field_2._M_allocated_capacity);
  std::swap<minibag::EncryptorBase>
            ((shared_ptr<minibag::EncryptorBase> *)in_RSI,
             (shared_ptr<minibag::EncryptorBase> *)in_RDI);
  return;
}

Assistant:

void Bag::swap(Bag& other) {
    using std::swap;
    swap(mode_, other.mode_);
    swap(file_, other.file_);
    swap(version_, other.version_);
    swap(compression_, other.compression_);
    swap(chunk_threshold_, other.chunk_threshold_);
    swap(bag_revision_, other.bag_revision_);
    swap(file_size_, other.file_size_);
    swap(file_header_pos_, other.file_header_pos_);
    swap(index_data_pos_, other.index_data_pos_);
    swap(connection_count_, other.connection_count_);
    swap(chunk_count_, other.chunk_count_);
    swap(chunk_open_, other.chunk_open_);
    swap(curr_chunk_info_, other.curr_chunk_info_);
    swap(curr_chunk_data_pos_, other.curr_chunk_data_pos_);
    swap(topic_connection_ids_, other.topic_connection_ids_);
    swap(header_connection_ids_, other.header_connection_ids_);
    swap(connections_, other.connections_);
    swap(chunks_, other.chunks_);
    swap(connection_indexes_, other.connection_indexes_);
    swap(curr_chunk_connection_indexes_, other.curr_chunk_connection_indexes_);
    swap(header_buffer_, other.header_buffer_);
    swap(record_buffer_, other.record_buffer_);
    swap(chunk_buffer_, other.chunk_buffer_);
    swap(decompress_buffer_, other.decompress_buffer_);
    swap(outgoing_chunk_buffer_, other.outgoing_chunk_buffer_);
    swap(current_buffer_, other.current_buffer_);
    swap(decompressed_chunk_, other.decompressed_chunk_);
    swap(encryptor_, other.encryptor_);
}